

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkGraphicsPipelineCreateInfo *pipe,SubpassMeta *subpass_meta,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  uint uVar1;
  int iVar2;
  VkPipelineDynamicStateCreateInfo *pVVar3;
  void *pvVar4;
  VkVertexInputAttributeDescription *pVVar5;
  VkVertexInputBindingDescription *pVVar6;
  byte bVar7;
  bool bVar8;
  ulong uVar9;
  VkPipelineMultisampleStateCreateInfo *pVVar10;
  VkPipelineVertexInputStateCreateInfo *pVVar11;
  VkPipelineColorBlendStateCreateInfo *pVVar12;
  VkPipelineViewportStateCreateInfo *pVVar13;
  byte bVar14;
  bool bVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  VkPipelineColorBlendAttachmentState *pVVar20;
  GlobalStateInfo GVar21;
  Value nexts;
  Value tess;
  VkPipelineColorBlendAttachmentState blank_attachment;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  Value sm;
  Value bindings;
  Data local_1d8;
  Value attrib;
  DynamicStateInfo dynamic_info;
  Value att;
  StringRefType local_140;
  StringRefType local_130;
  StringRefType local_120;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_1d8.n.i64 = (Number)0x0;
  local_1d8.s.str = (Ch *)0x3000000000000;
  dynamic_info._0_8_ = ZEXT48(pipe->flags);
  blank_attachment.dstColorBlendFactor = 0x150d6f;
  blank_attachment.colorBlendOp = 0x4050000;
  blank_attachment.blendEnable = 5;
  blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  dynamic_info._8_8_ = (ulong)(-1 < (int)pipe->flags) << 0x35 | 0x1d6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&blank_attachment,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&blank_attachment,(uint64_t)pipe->basePipelineHandle,alloc);
  dynamic_info.viewport = true;
  dynamic_info.scissor_count = true;
  dynamic_info.viewport_count = true;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = true;
  dynamic_info.depth_compare_op = true;
  dynamic_info.stencil_compare = true;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&blank_attachment,alloc);
  local_40.s = "basePipelineIndex";
  local_40.length = 0x11;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_1d8.s,&local_40,pipe->basePipelineIndex,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&blank_attachment,(uint64_t)pipe->layout,alloc);
  dynamic_info.viewport = true;
  dynamic_info.scissor_count = true;
  dynamic_info.viewport_count = true;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = true;
  dynamic_info.depth_compare_op = true;
  dynamic_info.stencil_compare = true;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&blank_attachment,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&blank_attachment,(uint64_t)pipe->renderPass,alloc);
  dynamic_info.viewport = true;
  dynamic_info.scissor_count = true;
  dynamic_info.viewport_count = true;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = true;
  dynamic_info.depth_compare_op = true;
  dynamic_info.stencil_compare = true;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&blank_attachment,alloc);
  dynamic_info._0_8_ = ZEXT48(pipe->subpass);
  blank_attachment.dstColorBlendFactor = 0x1514aa;
  blank_attachment.colorBlendOp = 0x4050000;
  blank_attachment.blendEnable = 7;
  blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  dynamic_info._8_8_ = (ulong)(-1 < (int)pipe->subpass) << 0x35 | 0x1d6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&blank_attachment,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,alloc);
  dynamic_info.color_blend_advanced = false;
  dynamic_info.provoking_vertex_mode = false;
  dynamic_info.line_rasterization_mode = false;
  dynamic_info.line_stipple_enable = false;
  dynamic_info.depth_clip_negative_one_to_one = false;
  dynamic_info.viewport_w_scaling_enable = false;
  dynamic_info.viewport_swizzle = false;
  dynamic_info.coverage_to_color_enable = false;
  dynamic_info.coverage_to_color_location = false;
  dynamic_info.coverage_modulation_mode = false;
  dynamic_info.coverage_modulation_table_enable = false;
  dynamic_info.coverage_modulation_table = false;
  dynamic_info.shading_rate_image_enable = false;
  dynamic_info.representative_fragment_test_enable = false;
  dynamic_info.coverage_reduction_mode = false;
  dynamic_info.depth_clamp_range = false;
  dynamic_info.tessellation_domain_origin = false;
  dynamic_info.depth_clamp_enable = false;
  dynamic_info.polygon_mode = false;
  dynamic_info.rasterization_samples = false;
  dynamic_info.sample_mask = false;
  dynamic_info.alpha_to_coverage_enable = false;
  dynamic_info.alpha_to_one_enable = false;
  dynamic_info.logic_op_enable = false;
  dynamic_info.color_blend_enable = false;
  dynamic_info.color_blend_equation = false;
  dynamic_info.color_write_mask = false;
  dynamic_info.rasterization_stream = false;
  dynamic_info.conservative_rasterization_mode = false;
  dynamic_info.extra_primitive_overestimation_size = false;
  dynamic_info.depth_clip_enable = false;
  dynamic_info.sample_locations_enable = false;
  dynamic_info.depth_bounds_test_enable = false;
  dynamic_info.stencil_test_enable = false;
  dynamic_info.stencil_op = false;
  dynamic_info.vertex_input = false;
  dynamic_info.vertex_input_binding_stride = false;
  dynamic_info.patch_control_points = false;
  dynamic_info.rasterizer_discard_enable = false;
  dynamic_info.primitive_restart_enable = false;
  dynamic_info.logic_op = false;
  dynamic_info.color_write_enable = false;
  dynamic_info.depth_bias_enable = false;
  dynamic_info.discard_rectangle = false;
  dynamic_info.discard_rectangle_mode = false;
  dynamic_info.fragment_shading_rate = false;
  dynamic_info.sample_locations = false;
  dynamic_info.line_stipple = false;
  dynamic_info.stencil_compare = false;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  dynamic_info.viewport = false;
  dynamic_info.scissor_count = false;
  dynamic_info.viewport_count = false;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = false;
  dynamic_info.depth_compare_op = false;
  pVVar3 = pipe->pDynamicState;
  if (pVVar3 == (VkPipelineDynamicStateCreateInfo *)0x0) {
    bVar7 = 0;
    bVar14 = 0;
  }
  else {
    Hashing::parse_dynamic_state_info
              ((DynamicStateInfo *)&blank_attachment,(Hashing *)(ulong)pVVar3->dynamicStateCount,
               (VkPipelineDynamicStateCreateInfo *)pVVar3->pDynamicStates);
    dynamic_info._48_8_ = local_218;
    dynamic_info._56_8_ = uStack_210;
    dynamic_info._32_8_ = local_228;
    dynamic_info._40_8_ = uStack_220;
    bVar14 = blank_attachment.srcAlphaBlendFactor._3_1_;
    dynamic_info._24_8_ = blank_attachment._24_8_;
    dynamic_info._0_8_ = blank_attachment._0_8_;
    dynamic_info._8_8_ = blank_attachment._8_8_;
    dynamic_info.rasterizer_discard_enable = blank_attachment.dstAlphaBlendFactor._2_1_;
    bVar7 = dynamic_info.rasterizer_discard_enable;
    dynamic_info._16_8_ = blank_attachment._16_8_;
  }
  GVar21 = Hashing::parse_global_state_info
                     (pipe,(DynamicStateInfo *)(ulong)bVar14,(SubpassMeta *)(ulong)bVar7);
  uVar9 = GVar21._0_8_;
  uVar18 = GVar21._0_4_;
  if ((uVar18 >> 8 & 1) == 0) {
LAB_001079a2:
    if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                (pipe->pDynamicState,alloc,&nexts);
      blank_attachment.dstColorBlendFactor = 0x151356;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0xc;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&nexts,alloc);
    }
    if ((uVar18 >> 0x18 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar19 = pipe->pMultisampleState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x405000000150d6f;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_50.s = "rasterizationSamples";
      local_50.length = 0x14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkSampleCountFlagBits>
                (&tess,&local_50,pipe->pMultisampleState->rasterizationSamples,alloc);
      uVar19 = pipe->pMultisampleState->sampleShadingEnable;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x40500000015132d;
      nexts.data_.n = (Number)0x13;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pMultisampleState->minSampleShading;
      nexts.data_.s.str = (Ch *)0x405000000151311;
      nexts.data_.n = (Number)0x10;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar19 = pipe->pMultisampleState->alphaToOneEnable;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x405000000151300;
      nexts.data_.n = (Number)0x10;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar19 = pipe->pMultisampleState->alphaToCoverageEnable;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x4050000001512ea;
      nexts.data_.n = (Number)0x15;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x4000000000000;
      pVVar10 = pipe->pMultisampleState;
      if (pVVar10->pSampleMask != (VkSampleMask *)0x0) {
        uVar19 = pVVar10->rasterizationSamples +
                 (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                  VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT);
        if (0x1f < uVar19) {
          uVar16 = 0;
          do {
            uVar1 = pipe->pMultisampleState->pSampleMask[uVar16];
            blank_attachment._0_8_ = ZEXT48(uVar1);
            blank_attachment._8_8_ = (ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&sm,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&blank_attachment,alloc);
            uVar16 = uVar16 + 1;
          } while (uVar19 >> 5 != uVar16);
        }
        blank_attachment.dstColorBlendFactor = 0x151322;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 10;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&sm,alloc);
        pVVar10 = pipe->pMultisampleState;
      }
      if (pVVar10->pNext != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pVVar10->pNext,alloc,&nexts,&dynamic_info);
        if (!bVar8) goto LAB_00109df4;
        blank_attachment.dstColorBlendFactor = 0x150e25;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x151507;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x10;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&tess,alloc);
    }
    if ((uVar9 >> 0x30 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x4000000000000;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x4000000000000;
      uVar19 = pipe->pVertexInputState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x405000000150d6f;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      pVVar11 = pipe->pVertexInputState;
      if (pVVar11->vertexAttributeDescriptionCount != 0) {
        lVar17 = 0xc;
        uVar16 = 0;
        do {
          pVVar5 = pVVar11->pVertexAttributeDescriptions;
          attrib.data_.n = (Number)0x0;
          attrib.data_.s.str = (Ch *)0x3000000000000;
          uVar19 = *(uint *)((long)pVVar5 + lVar17 + -0xc);
          blank_attachment._0_8_ = ZEXT48(uVar19);
          nexts.data_.s.str = (Ch *)0x405000000151088;
          nexts.data_.n = (Number)0x8;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          uVar19 = *(uint *)((long)pVVar5 + lVar17 + -8);
          blank_attachment._0_8_ = ZEXT48(uVar19);
          nexts.data_.s.str = (Ch *)0x405000000150d0e;
          nexts.data_.n = (Number)0x7;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          uVar19 = *(uint *)((long)&pVVar5->location + lVar17);
          blank_attachment._0_8_ = ZEXT48(uVar19);
          nexts.data_.s.str = (Ch *)0x405000000150d52;
          nexts.data_.n = (Number)0x6;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          local_b0.s = "format";
          local_b0.length = 6;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkFormat>(&attrib,&local_b0,*(VkFormat *)((long)pVVar5 + lVar17 + -4),alloc);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&sm,&attrib,alloc);
          uVar16 = uVar16 + 1;
          pVVar11 = pipe->pVertexInputState;
          lVar17 = lVar17 + 0x10;
        } while (uVar16 < pVVar11->vertexAttributeDescriptionCount);
      }
      if (pVVar11->vertexBindingDescriptionCount != 0) {
        lVar17 = 8;
        uVar16 = 0;
        do {
          pVVar6 = pVVar11->pVertexBindingDescriptions;
          attrib.data_.n = (Number)0x0;
          attrib.data_.s.str = (Ch *)0x3000000000000;
          uVar19 = *(uint *)((long)pVVar6 + lVar17 + -8);
          blank_attachment._0_8_ = ZEXT48(uVar19);
          nexts.data_.s.str = (Ch *)0x405000000150d0e;
          nexts.data_.n = (Number)0x7;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          uVar19 = *(uint *)((long)pVVar6 + lVar17 + -4);
          blank_attachment._0_8_ = ZEXT48(uVar19);
          nexts.data_.s.str = (Ch *)0x4050000001510a2;
          nexts.data_.n = (Number)0x6;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          local_c0.s = "inputRate";
          local_c0.length = 9;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkVertexInputRate>
                    (&attrib,&local_c0,*(VkVertexInputRate *)((long)&pVVar6->binding + lVar17),alloc
                    );
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&bindings,&attrib,alloc);
          uVar16 = uVar16 + 1;
          pVVar11 = pipe->pVertexInputState;
          lVar17 = lVar17 + 0xc;
        } while (uVar16 < pVVar11->vertexBindingDescriptionCount);
      }
      blank_attachment.dstColorBlendFactor = 0x1510a9;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 10;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&sm,alloc);
      blank_attachment.dstColorBlendFactor = 0x150e1c;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 8;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&bindings,alloc);
      pvVar4 = pipe->pVertexInputState->pNext;
      if (pvVar4 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar4,alloc,&nexts,&dynamic_info);
        if (!bVar8) goto LAB_00109df4;
        blank_attachment.dstColorBlendFactor = 0x150e25;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x15152b;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x10;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&tess,alloc);
    }
    if ((uVar9 >> 0x38 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar19 = pipe->pRasterizationState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x405000000150d6f;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pRasterizationState->depthBiasConstantFactor;
      nexts.data_.s.str = (Ch *)0x405000000151187;
      nexts.data_.n = (Number)0x17;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pRasterizationState->depthBiasSlopeFactor;
      nexts.data_.s.str = (Ch *)0x40500000015119f;
      nexts.data_.n = (Number)0x14;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pRasterizationState->depthBiasClamp;
      nexts.data_.s.str = (Ch *)0x405000000151178;
      nexts.data_.n = (Number)0xe;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar19 = pipe->pRasterizationState->depthBiasEnable;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x4050000001511d6;
      nexts.data_.n = (Number)0xf;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar19 = pipe->pRasterizationState->depthClampEnable;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x4050000001511e6;
      nexts.data_.n = (Number)0x10;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_60.s = "polygonMode";
      local_60.length = 0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPolygonMode>(&tess,&local_60,pipe->pRasterizationState->polygonMode,alloc);
      uVar19 = pipe->pRasterizationState->rasterizerDiscardEnable;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x4050000001511be;
      nexts.data_.n = (Number)0x17;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_70.s = "frontFace";
      local_70.length = 9;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkFrontFace>(&tess,&local_70,pipe->pRasterizationState->frontFace,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pRasterizationState->lineWidth;
      nexts.data_.s.str = (Ch *)0x4050000001511b4;
      nexts.data_.n = (Number)0x9;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar19 = pipe->pRasterizationState->cullMode;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x40500000015116f;
      nexts.data_.n = (Number)0x8;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      pvVar4 = pipe->pRasterizationState->pNext;
      if (pvVar4 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar4,alloc,&nexts,&dynamic_info);
        if (!bVar8) goto LAB_00109df4;
        blank_attachment.dstColorBlendFactor = 0x150e25;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x1514b2;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x12;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&tess,alloc);
    }
    if (((undefined1  [11])GVar21 & (undefined1  [11])0x1) != (undefined1  [11])0x0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar19 = pipe->pInputAssemblyState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x405000000150d6f;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_80.s = "topology";
      local_80.length = 8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPrimitiveTopology>(&tess,&local_80,pipe->pInputAssemblyState->topology,alloc);
      uVar19 = pipe->pInputAssemblyState->primitiveRestartEnable;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x405000000151220;
      nexts.data_.n = (Number)0x16;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      pvVar4 = pipe->pInputAssemblyState->pNext;
      if (pvVar4 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar4,alloc,&nexts,&dynamic_info);
        if (!bVar8) goto LAB_00109df4;
        blank_attachment.dstColorBlendFactor = 0x150e25;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x151518;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x12;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&tess,alloc);
    }
    if ((uVar9 >> 0x28 & 1) != 0) {
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x3000000000000;
      uVar19 = pipe->pColorBlendState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x405000000150d6f;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_90.s = "logicOp";
      local_90.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkLogicOp>(&sm,&local_90,pipe->pColorBlendState->logicOp,alloc);
      uVar19 = pipe->pColorBlendState->logicOpEnable;
      blank_attachment._0_8_ = ZEXT48(uVar19);
      nexts.data_.s.str = (Ch *)0x4050000001512cd;
      nexts.data_.n = (Number)0xd;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      if (((dynamic_info.color_blend_enable == true) && (dynamic_info.color_write_mask == true)) &&
         (dynamic_info.color_blend_equation == true)) {
        pVVar12 = pipe->pColorBlendState;
        bVar8 = true;
        bVar15 = false;
      }
      else {
        pVVar12 = pipe->pColorBlendState;
        if ((ulong)pVVar12->attachmentCount == 0) {
          bVar8 = false;
          bVar15 = true;
        }
        else {
          pVVar20 = pVVar12->pAttachments;
          lVar17 = 0;
          bVar14 = 0;
          do {
            if ((*(int *)((long)&pVVar20->blendEnable + lVar17) != 0) &&
               (((((iVar2 = *(int *)((long)&pVVar20->dstAlphaBlendFactor + lVar17), iVar2 == 10 ||
                   (iVar2 == 0xc)) ||
                  ((iVar2 = *(int *)((long)&pVVar20->srcAlphaBlendFactor + lVar17), iVar2 == 10 ||
                   ((iVar2 == 0xc ||
                    (iVar2 = *(int *)((long)&pVVar20->dstColorBlendFactor + lVar17), iVar2 == 10))))
                  )) || (iVar2 == 0xc)) ||
                ((iVar2 = *(int *)((long)&pVVar20->srcColorBlendFactor + lVar17), iVar2 == 0xc ||
                 (iVar2 == 10)))))) {
              bVar14 = 1;
            }
            lVar17 = lVar17 + 0x20;
          } while ((ulong)pVVar12->attachmentCount << 5 != lVar17);
          bVar15 = (bool)(bVar14 ^ 1);
          bVar8 = false;
        }
      }
      blank_attachment.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.alphaBlendOp = VK_BLEND_OP_ADD;
      blank_attachment.colorWriteMask = 0;
      blank_attachment.blendEnable = 0;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = VK_BLEND_OP_ADD;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x4000000000000;
      lVar17 = 0;
      do {
        nexts.data_.n = (Number)0.0;
        if ((dynamic_info._0_8_ & 0x1000000000000) == 0 && !bVar15) {
          nexts.data_.n = (Number)(double)*(float *)((long)pVVar12->blendConstants + lVar17);
        }
        nexts.data_.s.str = (Ch *)0x216000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&bindings,&nexts,alloc);
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0x10);
      nexts.data_.s.str = (Ch *)0x4050000001512db;
      nexts.data_.n = (Number)0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&nexts,&bindings,alloc);
      attrib.data_.n = (Number)0x0;
      attrib.data_.s.str = (Ch *)0x4000000000000;
      pVVar12 = pipe->pColorBlendState;
      if (pVVar12->attachmentCount != 0) {
        lVar17 = 0;
        uVar16 = 0;
        do {
          pVVar20 = &blank_attachment;
          if (!bVar8) {
            pVVar20 = (VkPipelineColorBlendAttachmentState *)
                      ((long)&pVVar12->pAttachments->blendEnable + lVar17);
          }
          att.data_.n = (Number)0x0;
          att.data_.s.str = (Ch *)0x3000000000000;
          local_d0.s = "dstAlphaBlendFactor";
          local_d0.length = 0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendFactor>(&att,&local_d0,pVVar20->dstAlphaBlendFactor,alloc);
          local_e0.s = "srcAlphaBlendFactor";
          local_e0.length = 0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendFactor>(&att,&local_e0,pVVar20->srcAlphaBlendFactor,alloc);
          local_f0.s = "dstColorBlendFactor";
          local_f0.length = 0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendFactor>(&att,&local_f0,pVVar20->dstColorBlendFactor,alloc);
          local_100.s = "srcColorBlendFactor";
          local_100.length = 0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendFactor>(&att,&local_100,pVVar20->srcColorBlendFactor,alloc);
          nexts.data_._4_1_ = '\0';
          nexts.data_._5_1_ = '\0';
          nexts.data_._6_1_ = '\0';
          nexts.data_._7_1_ = '\0';
          nexts.data_._0_4_ = pVVar20->colorWriteMask;
          tess.data_.s.str = (Ch *)0x40500000015124c;
          tess.data_.n = (Number)0xe;
          nexts.data_.s.str =
               (Ch *)((ulong)(-1 < (int)pVVar20->colorWriteMask) << 0x35 | 0x1d6000000000000);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&att,&tess,&nexts,alloc);
          local_110.s = "alphaBlendOp";
          local_110.length = 0xc;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendOp>(&att,&local_110,pVVar20->alphaBlendOp,alloc);
          local_120.s = "colorBlendOp";
          local_120.length = 0xc;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendOp>(&att,&local_120,pVVar20->colorBlendOp,alloc);
          nexts.data_._4_1_ = '\0';
          nexts.data_._5_1_ = '\0';
          nexts.data_._6_1_ = '\0';
          nexts.data_._7_1_ = '\0';
          nexts.data_._0_4_ = pVVar20->blendEnable;
          tess.data_.s.str = (Ch *)0x405000000151240;
          tess.data_.n = (Number)0xb;
          nexts.data_.s.str =
               (Ch *)((ulong)(-1 < (int)pVVar20->blendEnable) << 0x35 | 0x1d6000000000000);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&att,&tess,&nexts,alloc);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&attrib,&att,alloc);
          uVar16 = uVar16 + 1;
          pVVar12 = pipe->pColorBlendState;
          lVar17 = lVar17 + 0x20;
        } while (uVar16 < pVVar12->attachmentCount);
      }
      nexts.data_.s.str = (Ch *)0x405000000150ff5;
      nexts.data_.n = (Number)0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&nexts,&attrib,alloc);
      pvVar4 = pipe->pColorBlendState->pNext;
      if (pvVar4 != (void *)0x0) {
        tess.data_.n = (Number)0x0;
        tess.data_.s.str = (Ch *)0x0;
        bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar4,alloc,&tess,&dynamic_info);
        if (!bVar8) goto LAB_00109df4;
        nexts.data_.s.str = (Ch *)0x405000000150e25;
        nexts.data_.n = (Number)0x5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&sm,&nexts,&tess,alloc);
      }
      nexts.data_.s.str = (Ch *)0x4050000001514d7;
      nexts.data_.n = (Number)0xf;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,&nexts,&sm,alloc);
    }
    if ((uVar18 >> 0x10 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar18 = pipe->pViewportState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar18);
      nexts.data_.s.str = (Ch *)0x405000000150d6f;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar18 = pipe->pViewportState->viewportCount;
      blank_attachment._0_8_ = ZEXT48(uVar18);
      nexts.data_.s.str = (Ch *)0x405000000151415;
      nexts.data_.n = (Number)0xd;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar18 = pipe->pViewportState->scissorCount;
      blank_attachment._0_8_ = ZEXT48(uVar18);
      nexts.data_.s.str = (Ch *)0x4050000001513ff;
      nexts.data_.n = (Number)0xc;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      pVVar13 = pipe->pViewportState;
      if (pVVar13->pViewports != (VkViewport *)0x0) {
        sm.data_.n = (Number)0x0;
        sm.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar13->viewportCount != 0) {
          lVar17 = 0;
          uVar16 = 0;
          do {
            bindings.data_.n = (Number)0x0;
            bindings.data_.s.str = (Ch *)0x3000000000000;
            blank_attachment._0_8_ = (BADTYPE)*(float *)((long)&pVVar13->pViewports->x + lVar17);
            nexts.data_.s.str = (Ch *)0x40500000015072c;
            nexts.data_.n = (Number)0x1;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->y + lVar17);
            nexts.data_.s.str = (Ch *)0x405000000151cf5;
            nexts.data_.n = (Number)0x1;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->width + lVar17);
            nexts.data_.s.str = (Ch *)0x4050000001513e0;
            nexts.data_.n = (Number)0x5;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->height + lVar17);
            nexts.data_.s.str = (Ch *)0x4050000001513e6;
            nexts.data_.n = (Number)0x6;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->minDepth + lVar17);
            nexts.data_.s.str = (Ch *)0x4050000001513ed;
            nexts.data_.n = (Number)0x8;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->maxDepth + lVar17);
            nexts.data_.s.str = (Ch *)0x4050000001513f6;
            nexts.data_.n = (Number)0x8;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&sm,&bindings,alloc);
            uVar16 = uVar16 + 1;
            pVVar13 = pipe->pViewportState;
            lVar17 = lVar17 + 0x18;
          } while (uVar16 < pVVar13->viewportCount);
        }
        blank_attachment.dstColorBlendFactor = 0x151423;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 9;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&sm,alloc);
        pVVar13 = pipe->pViewportState;
      }
      if (pVVar13->pScissors != (VkRect2D *)0x0) {
        sm.data_.n = (Number)0x0;
        sm.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar13->scissorCount != 0) {
          lVar17 = 0;
          uVar16 = 0;
          do {
            bindings.data_.n = (Number)0x0;
            bindings.data_.s.str = (Ch *)0x3000000000000;
            local_130.s = "x";
            local_130.length = 1;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<int>(&bindings,&local_130,
                             *(int *)((long)&(pVVar13->pScissors->offset).x + lVar17),alloc);
            local_140.s = "y";
            local_140.length = 1;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<int>(&bindings,&local_140,
                             *(int *)((long)&(pipe->pViewportState->pScissors->offset).y + lVar17),
                             alloc);
            uVar18 = *(uint *)((long)&(pipe->pViewportState->pScissors->extent).width + lVar17);
            blank_attachment._0_8_ = ZEXT48(uVar18);
            nexts.data_.s.str = (Ch *)0x4050000001513e0;
            nexts.data_.n = (Number)0x5;
            blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            uVar18 = *(uint *)((long)&(pipe->pViewportState->pScissors->extent).height + lVar17);
            blank_attachment._0_8_ = ZEXT48(uVar18);
            nexts.data_.s.str = (Ch *)0x4050000001513e6;
            nexts.data_.n = (Number)0x6;
            blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&sm,&bindings,alloc);
            uVar16 = uVar16 + 1;
            pVVar13 = pipe->pViewportState;
            lVar17 = lVar17 + 0x10;
          } while (uVar16 < pVVar13->scissorCount);
        }
        blank_attachment.dstColorBlendFactor = 0x15140c;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 8;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&sm,alloc);
        pVVar13 = pipe->pViewportState;
      }
      if (pVVar13->pNext != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pVVar13->pNext,alloc,&nexts,&dynamic_info);
        if (!bVar8) goto LAB_00109df4;
        blank_attachment.dstColorBlendFactor = 0x150e25;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x1514f9;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0xd;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&tess,alloc);
    }
    if ((uVar9 >> 0x20 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar18 = pipe->pDepthStencilState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar18);
      nexts.data_.s.str = (Ch *)0x405000000150d6f;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar18 = pipe->pDepthStencilState->stencilTestEnable;
      blank_attachment._0_8_ = ZEXT48(uVar18);
      nexts.data_.s.str = (Ch *)0x405000000151118;
      nexts.data_.n = (Number)0x11;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pDepthStencilState->maxDepthBounds;
      nexts.data_.s.str = (Ch *)0x405000000151109;
      nexts.data_.n = (Number)0xe;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pDepthStencilState->minDepthBounds;
      nexts.data_.s.str = (Ch *)0x4050000001510fa;
      nexts.data_.n = (Number)0xe;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar18 = pipe->pDepthStencilState->depthBoundsTestEnable;
      blank_attachment._0_8_ = ZEXT48(uVar18);
      nexts.data_.s.str = (Ch *)0x4050000001510b4;
      nexts.data_.n = (Number)0x15;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar18 = pipe->pDepthStencilState->depthWriteEnable;
      blank_attachment._0_8_ = ZEXT48(uVar18);
      nexts.data_.s.str = (Ch *)0x4050000001510e9;
      nexts.data_.n = (Number)0x10;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar18 = pipe->pDepthStencilState->depthTestEnable;
      blank_attachment._0_8_ = ZEXT48(uVar18);
      nexts.data_.s.str = (Ch *)0x4050000001510d9;
      nexts.data_.n = (Number)0xf;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar18) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_a0.s = "depthCompareOp";
      local_a0.length = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkCompareOp>(&tess,&local_a0,pipe->pDepthStencilState->depthCompareOp,alloc);
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x3000000000000;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x3000000000000;
      attrib.data_.n = (Number)alloc;
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::anon_class_8_1_a7a39255
      ::operator()((anon_class_8_1_a7a39255 *)&attrib,&sm,&pipe->pDepthStencilState->front);
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::anon_class_8_1_a7a39255
      ::operator()((anon_class_8_1_a7a39255 *)&attrib,&bindings,&pipe->pDepthStencilState->back);
      blank_attachment.dstColorBlendFactor = 0x15112a;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 5;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&sm,alloc);
      blank_attachment.dstColorBlendFactor = 0x15116a;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 4;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&bindings,alloc);
      pvVar4 = pipe->pDepthStencilState->pNext;
      if (pvVar4 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar4,alloc,&nexts,&dynamic_info);
        if (!bVar8) goto LAB_00109df4;
        blank_attachment.dstColorBlendFactor = 0x150e25;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x1514e7;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x11;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&tess,alloc);
    }
    if ((GVar21._8_3_ >> 0x10 & 1) != 0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      bVar8 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pStages,pipe->stageCount,alloc,&nexts);
      if (!bVar8) goto LAB_00109df4;
      blank_attachment.dstColorBlendFactor = 0x151468;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 6;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&nexts,alloc);
    }
    if (pipe->pNext != (void *)0x0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pNext,alloc,&nexts,&dynamic_info);
      if (!bVar8) goto LAB_00109df4;
      blank_attachment.dstColorBlendFactor = 0x150e25;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 5;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&nexts,alloc);
    }
    bVar8 = true;
    if (&local_1d8 != &out_value->data_) {
      (out_value->data_).n = local_1d8.n;
      (out_value->data_).s.str = local_1d8.s.str;
    }
  }
  else {
    tess.data_.n = (Number)0x0;
    tess.data_.s.str = (Ch *)0x3000000000000;
    uVar19 = pipe->pTessellationState->flags;
    blank_attachment._0_8_ = ZEXT48(uVar19);
    nexts.data_.s.str = (Ch *)0x405000000150d6f;
    nexts.data_.n = (Number)0x5;
    blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&tess,&nexts,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&blank_attachment,alloc);
    uVar19 = pipe->pTessellationState->patchControlPoints;
    blank_attachment._0_8_ = ZEXT48(uVar19);
    nexts.data_.s.str = (Ch *)0x40500000015120d;
    nexts.data_.n = (Number)0x12;
    blank_attachment._8_8_ = (ulong)(-1 < (int)uVar19) << 0x35 | 0x1d6000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&tess,&nexts,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&blank_attachment,alloc);
    pvVar4 = pipe->pTessellationState->pNext;
    if (pvVar4 == (void *)0x0) {
LAB_00107959:
      blank_attachment.dstColorBlendFactor = 0x1514c5;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x11;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,&tess,alloc);
      goto LAB_001079a2;
    }
    nexts.data_.n = (Number)0x0;
    nexts.data_.s.str = (Ch *)0x0;
    bVar8 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pvVar4,alloc,&nexts,&dynamic_info);
    if (bVar8) {
      blank_attachment.dstColorBlendFactor = 0x150e25;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 5;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&nexts,alloc);
      goto LAB_00107959;
    }
LAB_00109df4:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

static bool json_value(const VkGraphicsPipelineCreateInfo &pipe,
                       const StateRecorder::SubpassMeta &subpass_meta,
                       Allocator &alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("renderPass", uint64_string(api_object_cast<uint64_t>(pipe.renderPass), alloc), alloc);
	p.AddMember("subpass", pipe.subpass, alloc);

	DynamicStateInfo dynamic_info = {};
	if (pipe.pDynamicState)
		dynamic_info = Hashing::parse_dynamic_state_info(*pipe.pDynamicState);
	GlobalStateInfo global_info = Hashing::parse_global_state_info(pipe, dynamic_info, subpass_meta);

	if (global_info.tessellation_state)
	{
		Value tess(kObjectType);
		tess.AddMember("flags", pipe.pTessellationState->flags, alloc);
		tess.AddMember("patchControlPoints", pipe.pTessellationState->patchControlPoints, alloc);
		if (!pnext_chain_add_json_value(tess, *pipe.pTessellationState, alloc, &dynamic_info))
			return false;
		p.AddMember("tessellationState", tess, alloc);
	}

	if (pipe.pDynamicState)
	{
		Value dyn;
		if (!json_value(*pipe.pDynamicState, alloc, &dyn))
			return false;
		p.AddMember("dynamicState", dyn, alloc);
	}

	if (global_info.multisample_state)
	{
		Value ms(kObjectType);
		ms.AddMember("flags", pipe.pMultisampleState->flags, alloc);
		ms.AddMember("rasterizationSamples", pipe.pMultisampleState->rasterizationSamples, alloc);
		ms.AddMember("sampleShadingEnable", pipe.pMultisampleState->sampleShadingEnable, alloc);
		ms.AddMember("minSampleShading", pipe.pMultisampleState->minSampleShading, alloc);
		ms.AddMember("alphaToOneEnable", pipe.pMultisampleState->alphaToOneEnable, alloc);
		ms.AddMember("alphaToCoverageEnable", pipe.pMultisampleState->alphaToCoverageEnable, alloc);

		Value sm(kArrayType);
		if (pipe.pMultisampleState->pSampleMask)
		{
			auto entries = uint32_t(pipe.pMultisampleState->rasterizationSamples + 31) / 32;
			for (uint32_t i = 0; i < entries; i++)
				sm.PushBack(pipe.pMultisampleState->pSampleMask[i], alloc);
			ms.AddMember("sampleMask", sm, alloc);
		}

		if (!pnext_chain_add_json_value(ms, *pipe.pMultisampleState, alloc, &dynamic_info))
			return false;
		p.AddMember("multisampleState", ms, alloc);
	}

	if (global_info.vertex_input)
	{
		Value vi(kObjectType);

		Value attribs(kArrayType);
		Value bindings(kArrayType);
		vi.AddMember("flags", pipe.pVertexInputState->flags, alloc);

		for (uint32_t i = 0; i < pipe.pVertexInputState->vertexAttributeDescriptionCount; i++)
		{
			auto &a = pipe.pVertexInputState->pVertexAttributeDescriptions[i];
			Value attrib(kObjectType);
			attrib.AddMember("location", a.location, alloc);
			attrib.AddMember("binding", a.binding, alloc);
			attrib.AddMember("offset", a.offset, alloc);
			attrib.AddMember("format", a.format, alloc);
			attribs.PushBack(attrib, alloc);
		}

		for (uint32_t i = 0; i < pipe.pVertexInputState->vertexBindingDescriptionCount; i++)
		{
			auto &b = pipe.pVertexInputState->pVertexBindingDescriptions[i];
			Value binding(kObjectType);
			binding.AddMember("binding", b.binding, alloc);
			binding.AddMember("stride", b.stride, alloc);
			binding.AddMember("inputRate", b.inputRate, alloc);
			bindings.PushBack(binding, alloc);
		}
		vi.AddMember("attributes", attribs, alloc);
		vi.AddMember("bindings", bindings, alloc);
		if (!pnext_chain_add_json_value(vi, *pipe.pVertexInputState, alloc, &dynamic_info))
			return false;
		p.AddMember("vertexInputState", vi, alloc);
	}

	if (global_info.rasterization_state)
	{
		Value rs(kObjectType);
		rs.AddMember("flags", pipe.pRasterizationState->flags, alloc);
		rs.AddMember("depthBiasConstantFactor", pipe.pRasterizationState->depthBiasConstantFactor, alloc);
		rs.AddMember("depthBiasSlopeFactor", pipe.pRasterizationState->depthBiasSlopeFactor, alloc);
		rs.AddMember("depthBiasClamp", pipe.pRasterizationState->depthBiasClamp, alloc);
		rs.AddMember("depthBiasEnable", pipe.pRasterizationState->depthBiasEnable, alloc);
		rs.AddMember("depthClampEnable", pipe.pRasterizationState->depthClampEnable, alloc);
		rs.AddMember("polygonMode", pipe.pRasterizationState->polygonMode, alloc);
		rs.AddMember("rasterizerDiscardEnable", pipe.pRasterizationState->rasterizerDiscardEnable, alloc);
		rs.AddMember("frontFace", pipe.pRasterizationState->frontFace, alloc);
		rs.AddMember("lineWidth", pipe.pRasterizationState->lineWidth, alloc);
		rs.AddMember("cullMode", pipe.pRasterizationState->cullMode, alloc);
		if (!pnext_chain_add_json_value(rs, *pipe.pRasterizationState, alloc, &dynamic_info))
			return false;
		p.AddMember("rasterizationState", rs, alloc);
	}

	if (global_info.input_assembly)
	{
		Value ia(kObjectType);
		ia.AddMember("flags", pipe.pInputAssemblyState->flags, alloc);
		ia.AddMember("topology", pipe.pInputAssemblyState->topology, alloc);
		ia.AddMember("primitiveRestartEnable", pipe.pInputAssemblyState->primitiveRestartEnable, alloc);
		if (!pnext_chain_add_json_value(ia, *pipe.pInputAssemblyState, alloc, &dynamic_info))
			return false;
		p.AddMember("inputAssemblyState", ia, alloc);
	}

	if (global_info.color_blend_state)
	{
		Value cb(kObjectType);
		cb.AddMember("flags", pipe.pColorBlendState->flags, alloc);
		cb.AddMember("logicOp", pipe.pColorBlendState->logicOp, alloc);
		cb.AddMember("logicOpEnable", pipe.pColorBlendState->logicOpEnable, alloc);

		bool need_blend_constants = false;
		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		if (dynamic_attachments)
		{
			need_blend_constants = true;
		}
		else
		{
			for (uint32_t i = 0; i < pipe.pColorBlendState->attachmentCount; i++)
			{
				auto &a = pipe.pColorBlendState->pAttachments[i];

				if (a.blendEnable &&
				    (a.dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR))
				{
					need_blend_constants = true;
				}
			}
		}

		const VkPipelineColorBlendAttachmentState blank_attachment = {};

		Value blend_constants(kArrayType);
		for (auto &c : pipe.pColorBlendState->blendConstants)
			blend_constants.PushBack(dynamic_info.blend_constants || !need_blend_constants ? 0.0f : c, alloc);
		cb.AddMember("blendConstants", blend_constants, alloc);
		Value attachments(kArrayType);
		for (uint32_t i = 0; i < pipe.pColorBlendState->attachmentCount; i++)
		{
			// We cannot completely decouple pAttachments from attachmentCount.
			// Just serialize dummy entries.

			auto &a = dynamic_attachments ? blank_attachment : pipe.pColorBlendState->pAttachments[i];
			Value att(kObjectType);
			att.AddMember("dstAlphaBlendFactor", a.dstAlphaBlendFactor, alloc);
			att.AddMember("srcAlphaBlendFactor", a.srcAlphaBlendFactor, alloc);
			att.AddMember("dstColorBlendFactor", a.dstColorBlendFactor, alloc);
			att.AddMember("srcColorBlendFactor", a.srcColorBlendFactor, alloc);
			att.AddMember("colorWriteMask", a.colorWriteMask, alloc);
			att.AddMember("alphaBlendOp", a.alphaBlendOp, alloc);
			att.AddMember("colorBlendOp", a.colorBlendOp, alloc);
			att.AddMember("blendEnable", a.blendEnable, alloc);
			attachments.PushBack(att, alloc);
		}
		cb.AddMember("attachments", attachments, alloc);
		if (!pnext_chain_add_json_value(cb, *pipe.pColorBlendState, alloc, &dynamic_info))
			return false;
		p.AddMember("colorBlendState", cb, alloc);
	}

	if (global_info.viewport_state)
	{
		Value vp(kObjectType);
		vp.AddMember("flags", pipe.pViewportState->flags, alloc);
		vp.AddMember("viewportCount", pipe.pViewportState->viewportCount, alloc);
		vp.AddMember("scissorCount", pipe.pViewportState->scissorCount, alloc);
		if (pipe.pViewportState->pViewports)
		{
			Value viewports(kArrayType);
			for (uint32_t i = 0; i < pipe.pViewportState->viewportCount; i++)
			{
				Value viewport(kObjectType);
				viewport.AddMember("x", pipe.pViewportState->pViewports[i].x, alloc);
				viewport.AddMember("y", pipe.pViewportState->pViewports[i].y, alloc);
				viewport.AddMember("width", pipe.pViewportState->pViewports[i].width, alloc);
				viewport.AddMember("height", pipe.pViewportState->pViewports[i].height, alloc);
				viewport.AddMember("minDepth", pipe.pViewportState->pViewports[i].minDepth, alloc);
				viewport.AddMember("maxDepth", pipe.pViewportState->pViewports[i].maxDepth, alloc);
				viewports.PushBack(viewport, alloc);
			}
			vp.AddMember("viewports", viewports, alloc);
		}

		if (pipe.pViewportState->pScissors)
		{
			Value scissors(kArrayType);
			for (uint32_t i = 0; i < pipe.pViewportState->scissorCount; i++)
			{
				Value scissor(kObjectType);
				scissor.AddMember("x", pipe.pViewportState->pScissors[i].offset.x, alloc);
				scissor.AddMember("y", pipe.pViewportState->pScissors[i].offset.y, alloc);
				scissor.AddMember("width", pipe.pViewportState->pScissors[i].extent.width, alloc);
				scissor.AddMember("height", pipe.pViewportState->pScissors[i].extent.height, alloc);
				scissors.PushBack(scissor, alloc);
			}
			vp.AddMember("scissors", scissors, alloc);
		}
		if (!pnext_chain_add_json_value(vp, *pipe.pViewportState, alloc, &dynamic_info))
			return false;
		p.AddMember("viewportState", vp, alloc);
	}

	if (global_info.depth_stencil_state)
	{
		Value ds(kObjectType);
		ds.AddMember("flags", pipe.pDepthStencilState->flags, alloc);
		ds.AddMember("stencilTestEnable", pipe.pDepthStencilState->stencilTestEnable, alloc);
		ds.AddMember("maxDepthBounds", pipe.pDepthStencilState->maxDepthBounds, alloc);
		ds.AddMember("minDepthBounds", pipe.pDepthStencilState->minDepthBounds, alloc);
		ds.AddMember("depthBoundsTestEnable", pipe.pDepthStencilState->depthBoundsTestEnable, alloc);
		ds.AddMember("depthWriteEnable", pipe.pDepthStencilState->depthWriteEnable, alloc);
		ds.AddMember("depthTestEnable", pipe.pDepthStencilState->depthTestEnable, alloc);
		ds.AddMember("depthCompareOp", pipe.pDepthStencilState->depthCompareOp, alloc);

		const auto serialize_stencil = [&](Value &v, const VkStencilOpState &state) {
			v.AddMember("compareOp", state.compareOp, alloc);
			v.AddMember("writeMask", state.writeMask, alloc);
			v.AddMember("reference", state.reference, alloc);
			v.AddMember("compareMask", state.compareMask, alloc);
			v.AddMember("passOp", state.passOp, alloc);
			v.AddMember("failOp", state.failOp, alloc);
			v.AddMember("depthFailOp", state.depthFailOp, alloc);
		};
		Value front(kObjectType);
		Value back(kObjectType);
		serialize_stencil(front, pipe.pDepthStencilState->front);
		serialize_stencil(back, pipe.pDepthStencilState->back);
		ds.AddMember("front", front, alloc);
		ds.AddMember("back", back, alloc);
		if (!pnext_chain_add_json_value(ds, *pipe.pDepthStencilState, alloc, &dynamic_info))
			return false;
		p.AddMember("depthStencilState", ds, alloc);
	}

	if (global_info.module_state)
	{
		Value stages;
		if (!json_value(pipe.pStages, pipe.stageCount, alloc, &stages))
			return false;
		p.AddMember("stages", stages, alloc);
	}

	if (!pnext_chain_add_json_value(p, pipe, alloc, &dynamic_info))
		return false;

	*out_value = p;
	return true;
}